

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

int gost_grasshopper_cipher_init_mgm(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  undefined4 uVar1;
  int iVar2;
  gost_grasshopper_cipher_ctx *c;
  undefined4 in_ECX;
  mgm128_context *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  int bl;
  gost_mgm_ctx *mctx;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  
  c = (gost_grasshopper_cipher_ctx *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  if ((in_RDX != (mgm128_context *)0x0) || (in_RSI != 0)) {
    if (in_RSI == 0) {
      if (c[10].encrypt_round_keys.k[5].d[0] == 0) {
        memcpy((void *)c[10].decrypt_round_keys.k[8].q[0],in_RDX,
               (long)*(int *)((long)c[10].decrypt_round_keys.k + 0x88));
      }
      else {
        iVar2 = gost_mgm128_setiv((mgm128_context *)c,
                                  (uchar *)CONCAT44(in_stack_ffffffffffffffcc,
                                                    in_stack_ffffffffffffffc8),0x12cfc8);
        if (iVar2 != 1) {
          return 0;
        }
      }
      *(undefined4 *)((long)c[10].encrypt_round_keys.k + 0x54) = 1;
    }
    else {
      uVar1 = EVP_CIPHER_CTX_get_iv_length(in_RDI);
      gost_grasshopper_cipher_key(c,(uint8_t *)CONCAT44(uVar1,in_stack_ffffffffffffffc8));
      gost_mgm128_init(in_RDX,(void *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),(block128_f)c,
                       (mul128_f)CONCAT44(uVar1,in_stack_ffffffffffffffc8),0);
      if ((in_RDX == (mgm128_context *)0x0) &&
         (*(int *)((long)c[10].encrypt_round_keys.k + 0x54) != 0)) {
        in_RDX = (mgm128_context *)c[10].decrypt_round_keys.k[8].q[0];
      }
      if (in_RDX != (mgm128_context *)0x0) {
        iVar2 = gost_mgm128_setiv((mgm128_context *)c,
                                  (uchar *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),0x12cf66);
        if (iVar2 != 1) {
          return 0;
        }
        *(undefined4 *)((long)c[10].encrypt_round_keys.k + 0x54) = 1;
      }
      c[10].encrypt_round_keys.k[5].d[0] = 1;
    }
  }
  return 1;
}

Assistant:

static GRASSHOPPER_INLINE int
gost_grasshopper_cipher_init_mgm(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                                 const unsigned char *iv, int enc)
{
    gost_mgm_ctx *mctx =
        (gost_mgm_ctx *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    int bl;

    if (!iv && !key)
        return 1;
    if (key) {
        bl = EVP_CIPHER_CTX_iv_length(ctx);
        gost_grasshopper_cipher_key(&mctx->ks.gh_ks, key);
        gost_mgm128_init(&mctx->mgm, &mctx->ks,
                         (block128_f) gost_grasshopper_encrypt_wrap, gf128_mul_uint64, bl);

        /*
         * If we have an iv can set it directly, otherwise use saved IV.
         */
        if (iv == NULL && mctx->iv_set)
            iv = mctx->iv;
        if (iv) {
            if (gost_mgm128_setiv(&mctx->mgm, iv, mctx->ivlen) != 1)
                return 0;
            mctx->iv_set = 1;
        }
        mctx->key_set = 1;
    } else {
        /* If key set use IV, otherwise copy */
        if (mctx->key_set) {
            if (gost_mgm128_setiv(&mctx->mgm, iv, mctx->ivlen) != 1)
                return 0;
        }
        else
            memcpy(mctx->iv, iv, mctx->ivlen);
        mctx->iv_set = 1;
    }
    return 1;
}